

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexNative_srell.h
# Opt level: O1

bool __thiscall
srell::regex_internal::re_compiler<char,_srell::u8regex_traits<char>_>::only_success_left
          (re_compiler<char,_srell::u8regex_traits<char>_> *this,size_type pos)

{
  pointer prVar1;
  bool bVar2;
  uint uVar3;
  byte unaff_R15B;
  
  do {
    prVar1 = (this->super_re_object_core<char,_srell::u8regex_traits<char>_>).NFA_states.buffer_;
    uVar3 = prVar1[pos].type - st_epsilon;
    switch(uVar3 >> 1 | (uint)((uVar3 & 1) != 0) << 0x1f) {
    case 0:
      if ((prVar1[pos].field_3.next_state2 == (re_state *)0x0) ||
         (bVar2 = only_success_left(this,(long)&(prVar1[pos].field_3.next_state2)->field_0 + pos),
         bVar2)) goto switchD_001bfb35_caseD_3;
      break;
    case 3:
switchD_001bfb35_caseD_3:
      if (prVar1[pos].field_2.next_state1 == (re_state *)0x0) break;
      pos = (long)&(prVar1[pos].field_2.next_state1)->field_0 + pos;
      bVar2 = true;
      goto LAB_001bfb7a;
    case 4:
    case 6:
      if ((prVar1[pos].field_3.next2 == 0) ||
         (prVar1[pos].field_2.next1 == prVar1[pos].field_3.next2)) goto switchD_001bfb35_caseD_3;
      break;
    case 9:
      unaff_R15B = 1;
      goto LAB_001bfb78;
    }
    unaff_R15B = 0;
LAB_001bfb78:
    bVar2 = false;
LAB_001bfb7a:
    if (!bVar2) {
      return (bool)(unaff_R15B & 1);
    }
  } while( true );
}

Assistant:

bool only_success_left(typename state_array::size_type pos) const
	{
		for (;;)
		{
			const state_type &state = this->NFA_states[pos];

			switch (state.type)
			{
			case st_success:
				return true;

			case st_roundbracket_close:
			case st_backreference:
				if (state.next2 != 0 && state.next1 != state.next2)
					return false;
				break;

			case st_epsilon:
				if (state.next2 != 0 && !only_success_left(pos + state.next2))
					return false;
				break;

			case st_roundbracket_open:
				break;	//  /a*()/

			default:
				return false;
			}
			if (state.next1)
				pos += state.next1;
			else
				return false;
		}
	}